

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall
AmpIO::ReadCollectedData(AmpIO *this,quadlet_t *buffer,unsigned_short offset,unsigned_short nquads)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  uint uVar3;
  __uint32_t _Var4;
  ushort local_34;
  unsigned_short i;
  bool ret;
  nodeaddr_t address;
  unsigned_short nquads_local;
  unsigned_short offset_local;
  quadlet_t *buffer_local;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 7) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 == 0x44514c41) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = (*((this->super_FpgaIO).super_BoardIO.port)->_vptr_BasePort[0x19])();
      if (uVar3 >> 2 < (uint)nquads) {
        this_local._7_1_ = false;
      }
      else if (offset < 0x400) {
        pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
        uVar3 = (*pBVar1->_vptr_BasePort[0x26])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (long)(int)(offset + 0x7000),buffer,(ulong)nquads << 2);
        this_local._7_1_ = (bool)((byte)uVar3 & 1);
        if ((uVar3 & 1) != 0) {
          for (local_34 = 0; local_34 < nquads; local_34 = local_34 + 1) {
            _Var4 = __bswap_32(buffer[local_34]);
            buffer[local_34] = _Var4;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::ReadCollectedData(quadlet_t *buffer, unsigned short offset, unsigned short nquads)
{
    if (GetFirmwareVersion() < 7) return false;
    if (GetHardwareVersion() == DQLA_String)
        return false;

    if (nquads > (port->GetMaxReadDataSize()/sizeof(quadlet_t))) return false;
    if (offset > 1023) return false;
    nodeaddr_t address = 0x7000 + offset;   // ADDR_DATA_BUF = 0x7000
    bool ret = port->ReadBlock(BoardId, address, buffer, nquads*sizeof(quadlet_t));
    if (ret) {
        for (unsigned short i = 0; i < nquads; i++)
            buffer[i] = bswap_32(buffer[i]);
    }
    return ret;
}